

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  bool bVar4;
  array_container_t *paVar5;
  rle16_t *prVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  ulong extraout_RDX;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int card;
  rle16_t rVar12;
  byte local_31;
  
  uVar7 = CONCAT71(in_register_00000011,typecode);
  local_31 = typecode;
  if ((int)uVar7 == 4) {
    c = shared_container_extract_copy((shared_container_t *)c,&local_31);
    uVar7 = extraout_RDX;
  }
  if (local_31 != 3) {
    if (local_31 != 2) {
      uVar7 = *(ulong *)(((run_container_t *)c)->runs + (ulong)(val >> 6) * 2);
      iVar11 = ((run_container_t *)c)->n_runs - (uint)((uVar7 >> ((ulong)val & 0x3f) & 1) != 0);
      ((run_container_t *)c)->n_runs = iVar11;
      *(ulong *)(((run_container_t *)c)->runs + (ulong)(val >> 6) * 2) =
           uVar7 & ~(1L << ((ulong)val & 0x3f));
      if (((uVar7 >> ((ulong)val & 0x3f) & 1) != 0) && (iVar11 < 0x1001)) {
        *new_typecode = '\x02';
        paVar5 = array_container_from_bitset((bitset_container_t *)c);
        return paVar5;
      }
      *new_typecode = local_31;
      return (run_container_t *)c;
    }
    *new_typecode = '\x02';
    prVar6 = ((run_container_t *)c)->runs;
    iVar11 = ((run_container_t *)c)->n_runs + -1;
    uVar10 = 0;
    do {
      if (iVar11 < (int)uVar10) {
        uVar9 = ~uVar10;
        break;
      }
      uVar9 = uVar10 + iVar11 >> 1;
      uVar1 = *(ushort *)((long)&prVar6->value + (ulong)(uVar10 + iVar11 & 0xfffffffe));
      if (uVar1 < val) {
        uVar10 = uVar9 + 1;
        bVar4 = true;
      }
      else if (val < uVar1) {
        iVar11 = uVar9 - 1;
        bVar4 = true;
      }
      else {
        bVar4 = false;
        uVar7 = (ulong)uVar9;
      }
      uVar9 = (uint)uVar7;
    } while (bVar4);
    if ((int)uVar9 < 0) {
      return (run_container_t *)c;
    }
    memmove(&prVar6->value + uVar9,&prVar6->length + uVar9,
            (long)(int)(((run_container_t *)c)->n_runs + ~uVar9) * 2);
    ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + -1;
    return (run_container_t *)c;
  }
  prVar6 = ((run_container_t *)c)->runs;
  iVar2 = ((run_container_t *)c)->n_runs;
  iVar11 = iVar2 + -1;
  uVar9 = 0;
  uVar10 = (uint)local_31;
  do {
    if (iVar11 < (int)uVar9) {
      uVar8 = ~uVar9;
      break;
    }
    uVar8 = uVar9 + iVar11 >> 1;
    if (prVar6[uVar8].value < val) {
      uVar9 = uVar8 + 1;
      bVar4 = true;
      uVar8 = uVar10;
    }
    else if (val < prVar6[uVar8].value) {
      iVar11 = uVar8 - 1;
      bVar4 = true;
      uVar8 = uVar10;
    }
    else {
      bVar4 = false;
    }
    uVar10 = uVar8;
  } while (bVar4);
  if ((int)uVar8 < 0) {
    if (uVar8 != 0xffffffff) {
      uVar7 = (ulong)(-uVar8 - 2);
      uVar10 = (uint)val - (uint)prVar6[uVar7].value;
      uVar1 = prVar6[uVar7].length;
      if ((int)uVar10 < (int)(uint)uVar1) {
        prVar6[uVar7].length = (ushort)uVar10 - 1;
        if (((run_container_t *)c)->capacity <= iVar2) {
          run_container_grow((run_container_t *)c,iVar2 + 1,true);
        }
        uVar7 = (ulong)(~uVar8 & 0xffff);
        memmove(((run_container_t *)c)->runs + uVar7 + 1,((run_container_t *)c)->runs + uVar7,
                ((long)((run_container_t *)c)->n_runs - uVar7) * 4);
        ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + 1;
        prVar6 = ((run_container_t *)c)->runs;
        uVar7 = (ulong)~uVar8;
        prVar6[uVar7].value = val + 1;
        uVar3 = ~(ushort)uVar10;
      }
      else {
        if (uVar10 != uVar1) goto LAB_0011b598;
        uVar3 = 0xffff;
      }
      prVar6[uVar7].length = uVar1 + uVar3;
    }
  }
  else if (prVar6[uVar8].length == 0) {
    uVar8 = uVar8 & 0xffff;
    memmove(prVar6 + uVar8,prVar6 + (ulong)uVar8 + 1,(long)(int)(iVar2 + ~uVar8) << 2);
    ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + -1;
  }
  else {
    rVar12.value = prVar6[uVar8].value + 1;
    rVar12.length = prVar6[uVar8].length - 1;
    prVar6[uVar8] = rVar12;
  }
LAB_0011b598:
  *new_typecode = '\x03';
  return (run_container_t *)c;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}